

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall crnlib::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  uint *puVar1;
  uint uVar2;
  
  if ((num_bits != 0) &&
     (this->m_total_bits_written = this->m_total_bits_written + num_bits,
     this->m_simulate_encoding == false)) {
    uVar2 = (this->m_output_syms).m_size;
    if ((this->m_output_syms).m_capacity <= uVar2) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_output_syms,uVar2 + 1,true,8,(object_mover)0x0,false);
    }
    (this->m_output_syms).m_p[(this->m_output_syms).m_size] =
         (output_symbol)(CONCAT44(num_bits,bits) & 0xffffffffffff);
    puVar1 = &(this->m_output_syms).m_size;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void symbol_codec::record_put_bits(uint bits, uint num_bits)
    {
        CRNLIB_ASSERT(m_mode == cEncoding);

        CRNLIB_ASSERT(num_bits <= 25);
        CRNLIB_ASSERT(m_bit_count >= 25);

        if (!num_bits)
        {
            return;
        }

        m_total_bits_written += num_bits;

        if (!m_simulate_encoding)
        {
            output_symbol sym;
            sym.m_bits = bits;
            sym.m_num_bits = (uint16)num_bits;
            sym.m_arith_prob0 = 0;
            m_output_syms.push_back(sym);
        }
    }